

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_insertAndFindFirstIndexHash3(ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip)

{
  U32 h;
  U32 *pUVar1;
  BYTE *pBVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  
  pUVar1 = ms->hashTable3;
  h = ms->hashLog3;
  pBVar2 = (ms->window).base;
  uVar6 = (ulong)*nextToUpdate3;
  sVar3 = ZSTD_hash3Ptr(ip,h);
  if (h != 0) {
    uVar5 = (int)ip - (int)pBVar2;
    for (; uVar6 < uVar5; uVar6 = uVar6 + 1) {
      sVar4 = ZSTD_hash3Ptr(pBVar2 + uVar6,h);
      pUVar1[sVar4] = (U32)uVar6;
    }
    *nextToUpdate3 = uVar5;
    return pUVar1[sVar3];
  }
  __assert_fail("hashLog3 > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x80c3,
                "U32 ZSTD_insertAndFindFirstIndexHash3(const ZSTD_matchState_t *, U32 *, const BYTE *const)"
               );
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndexHash3 (const ZSTD_matchState_t* ms,
                                              U32* nextToUpdate3,
                                              const BYTE* const ip)
{
    U32* const hashTable3 = ms->hashTable3;
    U32 const hashLog3 = ms->hashLog3;
    const BYTE* const base = ms->window.base;
    U32 idx = *nextToUpdate3;
    U32 const target = (U32)(ip - base);
    size_t const hash3 = ZSTD_hash3Ptr(ip, hashLog3);
    assert(hashLog3 > 0);

    while(idx < target) {
        hashTable3[ZSTD_hash3Ptr(base+idx, hashLog3)] = idx;
        idx++;
    }

    *nextToUpdate3 = target;
    return hashTable3[hash3];
}